

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O0

TestResult *
JsonTest::checkEqual<double,double>
          (TestResult *result,double expected,double actual,char *file,uint line,char *expr)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  TestResult *in_RDI;
  TestResult *in_XMM0_Qa;
  char *in_XMM1_Qa;
  char (*in_stack_00000178) [11];
  TestResult *in_stack_00000180;
  undefined4 in_stack_ffffffffffffffd8;
  
  if (((double)in_XMM0_Qa != (double)in_XMM1_Qa) ||
     (NAN((double)in_XMM0_Qa) || NAN((double)in_XMM1_Qa))) {
    TestResult::addFailure
              (in_XMM0_Qa,in_XMM1_Qa,(uint)((ulong)in_RSI >> 0x20),
               (char *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8));
    TestResult::operator<<(in_stack_00000180,in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(double *)in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(char (*) [2])in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(double *)in_stack_00000178);
  }
  return in_RDI;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}